

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedOutputStream::WriteRaw(CodedOutputStream *this,void *data,int size)

{
  bool bVar1;
  int local_1c;
  void *pvStack_18;
  int size_local;
  void *data_local;
  CodedOutputStream *this_local;
  
  local_1c = size;
  pvStack_18 = data;
  do {
    if (local_1c <= this->buffer_size_) {
      memcpy(this->buffer_,pvStack_18,(long)local_1c);
      Advance(this,local_1c);
      return;
    }
    memcpy(this->buffer_,pvStack_18,(long)this->buffer_size_);
    local_1c = local_1c - this->buffer_size_;
    pvStack_18 = (void *)((long)pvStack_18 + (long)this->buffer_size_);
    bVar1 = Refresh(this);
  } while (bVar1);
  return;
}

Assistant:

void CodedOutputStream::WriteRaw(const void* data, int size) {
  while (buffer_size_ < size) {
    memcpy(buffer_, data, buffer_size_);
    size -= buffer_size_;
    data = reinterpret_cast<const uint8*>(data) + buffer_size_;
    if (!Refresh()) return;
  }

  memcpy(buffer_, data, size);
  Advance(size);
}